

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_ameth.c
# Opt level: O0

int ossl_rsa_pss_to_ctx(EVP_MD_CTX *ctx,EVP_PKEY_CTX *pkctx,X509_ALGOR *sigalg,EVP_PKEY *pkey)

{
  int iVar1;
  RSA_PSS_PARAMS *a;
  EVP_PKEY *in_RCX;
  undefined8 *in_RDX;
  EVP_MD_CTX *in_RDI;
  EVP_MD *checkmd;
  RSA_PSS_PARAMS *pss;
  EVP_MD *md;
  EVP_MD *mgf1md;
  int saltlen;
  int rv;
  EVP_MD **in_stack_000000c0;
  EVP_PKEY_CTX *in_stack_000000c8;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  EVP_MD *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int line;
  EVP_MD *md_00;
  int local_2c;
  EVP_PKEY_CTX *local_18;
  EVP_MD_CTX *local_10;
  
  line = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_2c = -1;
  md_00 = (EVP_MD *)0x0;
  local_10 = in_RDI;
  iVar1 = OBJ_obj2nid((ASN1_OBJECT *)*in_RDX);
  if (iVar1 != 0x390) {
    ERR_new();
    ERR_set_debug((char *)md_00,line,(char *)in_stack_ffffffffffffffb0);
    ERR_set_error(4,0x9b,(char *)0x0);
    return -1;
  }
  a = ossl_rsa_pss_decode((X509_ALGOR *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  iVar1 = ossl_rsa_pss_get_param
                    ((RSA_PSS_PARAMS *)md_00,(EVP_MD **)a,(EVP_MD **)in_stack_ffffffffffffffb0,
                     (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (iVar1 == 0) {
    ERR_new();
    ERR_set_debug((char *)md_00,(int)((ulong)a >> 0x20),(char *)in_stack_ffffffffffffffb0);
    ERR_set_error(4,0x95,(char *)0x0);
    goto LAB_00456314;
  }
  if (in_RCX == (EVP_PKEY *)0x0) {
    iVar1 = EVP_PKEY_CTX_get_signature_md(in_stack_000000c8,in_stack_000000c0);
    if (iVar1 < 1) goto LAB_00456314;
    in_stack_ffffffffffffffac = EVP_MD_get_type(md_00);
    iVar1 = EVP_MD_get_type(in_stack_ffffffffffffffb0);
    if (in_stack_ffffffffffffffac != iVar1) {
      ERR_new();
      ERR_set_debug((char *)md_00,(int)((ulong)a >> 0x20),(char *)in_stack_ffffffffffffffb0);
      ERR_set_error(4,0x9e,(char *)0x0);
      goto LAB_00456314;
    }
  }
  else {
    iVar1 = EVP_DigestVerifyInit(local_10,&local_18,(EVP_MD *)md_00,(ENGINE *)0x0,in_RCX);
    if (iVar1 == 0) goto LAB_00456314;
  }
  iVar1 = EVP_PKEY_CTX_set_rsa_padding
                    ((EVP_PKEY_CTX *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if (((0 < iVar1) &&
      (iVar1 = EVP_PKEY_CTX_set_rsa_pss_saltlen
                         ((EVP_PKEY_CTX *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac),
      0 < iVar1)) &&
     (iVar1 = EVP_PKEY_CTX_set_rsa_mgf1_md
                        ((EVP_PKEY_CTX *)in_stack_ffffffffffffffb0,
                         (EVP_MD *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)),
     0 < iVar1)) {
    local_2c = 1;
  }
LAB_00456314:
  RSA_PSS_PARAMS_free((RSA_PSS_PARAMS *)a);
  return local_2c;
}

Assistant:

int ossl_rsa_pss_to_ctx(EVP_MD_CTX *ctx, EVP_PKEY_CTX *pkctx,
                        const X509_ALGOR *sigalg, EVP_PKEY *pkey)
{
    int rv = -1;
    int saltlen;
    const EVP_MD *mgf1md = NULL, *md = NULL;
    RSA_PSS_PARAMS *pss;

    /* Sanity check: make sure it is PSS */
    if (OBJ_obj2nid(sigalg->algorithm) != EVP_PKEY_RSA_PSS) {
        ERR_raise(ERR_LIB_RSA, RSA_R_UNSUPPORTED_SIGNATURE_TYPE);
        return -1;
    }
    /* Decode PSS parameters */
    pss = ossl_rsa_pss_decode(sigalg);

    if (!ossl_rsa_pss_get_param(pss, &md, &mgf1md, &saltlen)) {
        ERR_raise(ERR_LIB_RSA, RSA_R_INVALID_PSS_PARAMETERS);
        goto err;
    }

    /* We have all parameters now set up context */
    if (pkey) {
        if (!EVP_DigestVerifyInit(ctx, &pkctx, md, NULL, pkey))
            goto err;
    } else {
        const EVP_MD *checkmd;
        if (EVP_PKEY_CTX_get_signature_md(pkctx, &checkmd) <= 0)
            goto err;
        if (EVP_MD_get_type(md) != EVP_MD_get_type(checkmd)) {
            ERR_raise(ERR_LIB_RSA, RSA_R_DIGEST_DOES_NOT_MATCH);
            goto err;
        }
    }

    if (EVP_PKEY_CTX_set_rsa_padding(pkctx, RSA_PKCS1_PSS_PADDING) <= 0)
        goto err;

    if (EVP_PKEY_CTX_set_rsa_pss_saltlen(pkctx, saltlen) <= 0)
        goto err;

    if (EVP_PKEY_CTX_set_rsa_mgf1_md(pkctx, mgf1md) <= 0)
        goto err;
    /* Carry on */
    rv = 1;

 err:
    RSA_PSS_PARAMS_free(pss);
    return rv;
}